

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

char * __thiscall NULLCString::strchr(NULLCString *this,char *__s,int __c)

{
  char *pcVar1;
  char *pos;
  char ch_local;
  NULLCArray string_local;
  
  if (this == (NULLCString *)0x0) {
    nullcThrowError("string is null");
    string_local.ptr._4_4_ = 0xffffffff;
  }
  else if (((int)__s == 0) || (this[(int)__s - 1] != (NULLCString)0x0)) {
    nullcThrowError("string is not null-terminated");
    string_local.ptr._4_4_ = 0xffffffff;
  }
  else {
    pcVar1 = ::strchr((char *)this,(int)(char)__c);
    if (pcVar1 == (char *)0x0) {
      string_local.ptr._4_4_ = 0xffffffff;
    }
    else {
      string_local.ptr._4_4_ = (int)pcVar1 - (int)this;
    }
  }
  return (char *)(ulong)string_local.ptr._4_4_;
}

Assistant:

int strchr(NULLCArray string, char ch)
	{
		if(!string.ptr)
		{
			nullcThrowError("string is null");
			return -1;
		}

		if(string.len == 0 || string.ptr[string.len - 1])
		{
			nullcThrowError("string is not null-terminated");
			return -1;
		}

		if(const char *pos = ::strchr(string.ptr, ch))
			return int(pos - string.ptr);

		return -1;
	}